

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall tf::TFProfObserver::dump(TFProfObserver *this,ostream *os)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  vector<tf::Segment,_std::allocator<tf::Segment>_> *pvVar7;
  rep rVar8;
  ostream *poVar9;
  ulong uVar10;
  char *pcVar11;
  ostream *in_RSI;
  long in_RDI;
  value_type *s;
  size_t i;
  size_t l;
  size_t w;
  bool comma;
  size_t first;
  ostream *in_stack_ffffffffffffff58;
  ostream *in_stack_ffffffffffffff68;
  vector<tf::Segment,_std::allocator<tf::Segment>_> *in_stack_ffffffffffffff70;
  duration<long,_std::ratio<1L,_1000000L>_> local_58;
  rep local_50;
  duration<long,_std::ratio<1L,_1000000L>_> local_48;
  const_reference local_40;
  vector<tf::Segment,_std::allocator<tf::Segment>_> *local_38;
  ulong local_30;
  size_type local_28;
  byte local_19;
  ulong local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  for (local_18 = 0; uVar10 = local_18,
      sVar2 = std::
              vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
              ::size((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                      *)(in_RDI + 0x18)), uVar10 < sVar2; local_18 = local_18 + 1) {
    pvVar3 = std::
             vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                           *)(in_RDI + 0x18),local_18);
    sVar2 = std::
            vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
            ::size(pvVar3);
    if (sVar2 != 0) break;
  }
  uVar10 = local_18;
  sVar2 = std::
          vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
          ::size((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                  *)(in_RDI + 0x18));
  if (uVar10 == sVar2) {
    std::operator<<(local_10,"{}\n");
  }
  else {
    poVar4 = std::operator<<(local_10,"{\"executor\":\"");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ulong *)(in_RDI + 8));
    std::operator<<(poVar4,"\",\"data\":[");
    local_19 = 0;
    for (local_28 = local_18; sVar2 = local_28,
        sVar5 = std::
                vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ::size((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                        *)(in_RDI + 0x18)), sVar2 < sVar5; local_28 = local_28 + 1) {
      local_30 = 0;
      while( true ) {
        uVar10 = local_30;
        pvVar3 = std::
                 vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                               *)(in_RDI + 0x18),local_28);
        sVar2 = std::
                vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                ::size(pvVar3);
        if (sVar2 <= uVar10) break;
        pvVar3 = std::
                 vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                               *)(in_RDI + 0x18),local_28);
        std::
        vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
        ::operator[](pvVar3,local_30);
        bVar1 = std::vector<tf::Segment,_std::allocator<tf::Segment>_>::empty
                          (in_stack_ffffffffffffff70);
        if (!bVar1) {
          if ((local_19 & 1) == 0) {
            local_19 = 1;
          }
          else {
            std::operator<<(local_10,',');
          }
          poVar4 = std::operator<<(local_10,"{\"worker\":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
          poVar4 = std::operator<<(poVar4,",\"level\":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
          std::operator<<(poVar4,",\"data\":[");
          local_38 = (vector<tf::Segment,_std::allocator<tf::Segment>_> *)0x0;
          while( true ) {
            in_stack_ffffffffffffff70 = local_38;
            pvVar3 = std::
                     vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                     ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                   *)(in_RDI + 0x18),local_28);
            pvVar6 = std::
                     vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                     ::operator[](pvVar3,local_30);
            pvVar7 = (vector<tf::Segment,_std::allocator<tf::Segment>_> *)
                     std::vector<tf::Segment,_std::allocator<tf::Segment>_>::size(pvVar6);
            if (pvVar7 <= in_stack_ffffffffffffff70) break;
            pvVar3 = std::
                     vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                     ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                   *)(in_RDI + 0x18),local_28);
            pvVar6 = std::
                     vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                     ::operator[](pvVar3,local_30);
            local_40 = std::vector<tf::Segment,_std::allocator<tf::Segment>_>::operator[]
                                 (pvVar6,(size_type)local_38);
            if (local_38 != (vector<tf::Segment,_std::allocator<tf::Segment>_> *)0x0) {
              std::operator<<(local_10,',');
            }
            poVar4 = std::operator<<(local_10,"{\"span\":[");
            local_50 = (rep)std::chrono::operator-
                                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)in_stack_ffffffffffffff68,
                                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)poVar4);
            local_48.__r = (rep)std::chrono::
                                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                           in_stack_ffffffffffffff58);
            rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_48);
            poVar9 = (ostream *)std::ostream::operator<<(poVar4,rVar8);
            in_stack_ffffffffffffff68 = std::operator<<(poVar9,",");
            std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_ffffffffffffff68,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)poVar4);
            local_58.__r = (rep)std::chrono::
                                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                           in_stack_ffffffffffffff58);
            rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_58);
            poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff68,rVar8);
            std::operator<<(poVar4,"],");
            std::operator<<(local_10,"\"name\":\"");
            uVar10 = std::__cxx11::string::empty();
            if ((uVar10 & 1) == 0) {
              std::operator<<(local_10,(string *)local_40);
            }
            else {
              poVar4 = (ostream *)std::ostream::operator<<(local_10,local_28);
              poVar4 = std::operator<<(poVar4,'_');
              std::ostream::operator<<(poVar4,(ulong)local_38);
            }
            std::operator<<(local_10,"\",");
            in_stack_ffffffffffffff58 = std::operator<<(local_10,"\"type\":\"");
            pcVar11 = to_string(local_40->type);
            poVar4 = std::operator<<(in_stack_ffffffffffffff58,pcVar11);
            std::operator<<(poVar4,"\"");
            std::operator<<(local_10,"}");
            local_38 = (vector<tf::Segment,_std::allocator<tf::Segment>_> *)
                       ((long)&(local_38->
                               super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
          }
          std::operator<<(local_10,"]}");
        }
        local_30 = local_30 + 1;
      }
    }
    std::operator<<(local_10,"]}\n");
  }
  return;
}

Assistant:

inline void TFProfObserver::dump(std::ostream& os) const {

  using namespace std::chrono;

  size_t first;

  for(first = 0; first<_timeline.segments.size(); ++first) {
    if(_timeline.segments[first].size() > 0) { 
      break; 
    }
  }
  
  // not timeline data to dump
  if(first == _timeline.segments.size()) {
    os << "{}\n";
    return;
  }

  os << "{\"executor\":\"" << _timeline.uid << "\",\"data\":[";

  bool comma = false;

  for(size_t w=first; w<_timeline.segments.size(); w++) {
    for(size_t l=0; l<_timeline.segments[w].size(); l++) {

      if(_timeline.segments[w][l].empty()) {
        continue;
      }

      if(comma) {
        os << ',';
      }
      else {
        comma = true;
      }

      os << "{\"worker\":" << w << ",\"level\":" << l << ",\"data\":[";
      for(size_t i=0; i<_timeline.segments[w][l].size(); ++i) {

        const auto& s = _timeline.segments[w][l][i];

        if(i) os << ',';
        
        // span 
        os << "{\"span\":[" 
           << duration_cast<microseconds>(s.beg - _timeline.origin).count() 
           << ","
           << duration_cast<microseconds>(s.end - _timeline.origin).count() 
           << "],";
        
        // name
        os << "\"name\":\""; 
        if(s.name.empty()) {
          os << w << '_' << i;
        }
        else {
          os << s.name;
        }
        os << "\",";
    
        // e.g., category "type": "Condition Task"
        os << "\"type\":\"" << to_string(s.type) << "\"";

        os << "}";
      }
      os << "]}";
    }
  }

  os << "]}\n";
}